

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st2010.hpp
# Opt level: O2

void bcl::st2010::
     generate_transition_matrix<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
               (vector<double,_std::allocator<double>_> *weights,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *tm)

{
  double dVar1;
  pointer pdVar2;
  pointer pvVar3;
  long lVar4;
  double *pdVar5;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var6;
  size_t i;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> accum;
  allocator_type local_41;
  double local_40;
  _Vector_base<double,_std::allocator<double>_> local_38;
  value_type local_20;
  
  lVar9 = (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_20 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_38,lVar9 + 1,&local_20,&local_41);
  pdVar5 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = 0.0;
  for (; pdVar5 != (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pdVar5 = pdVar5 + 1) {
    local_40 = local_40 + *pdVar5;
  }
  _Var6 = std::
          __max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ();
  dVar1 = *_Var6._M_current;
  *local_38._M_impl.super__Vector_impl_data._M_start = 0.0;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar10 = 0.0;
  for (lVar7 = 0; lVar9 != lVar7; lVar7 = lVar7 + 1) {
    dVar10 = dVar10 + pdVar2[lVar7] / local_40;
    local_38._M_impl.super__Vector_impl_data._M_start[lVar7 + 1] = dVar10;
  }
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar3 = (tm->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (lVar7 = 0; lVar7 != lVar9; lVar7 = lVar7 + 1) {
    lVar4 = *(long *)&pvVar3[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 1) {
      auVar14._0_8_ =
           local_38._M_impl.super__Vector_impl_data._M_start[lVar7 + 1] + dVar1 / local_40;
      dVar10 = local_38._M_impl.super__Vector_impl_data._M_start[lVar7] + dVar1 / local_40;
      auVar13._8_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar8 + 1] + 1.0;
      auVar13._0_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar8 + 1];
      auVar14._8_8_ = auVar14._0_8_;
      auVar14 = minpd(auVar13,auVar14);
      auVar11._8_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar8] + 1.0;
      auVar11._0_8_ = local_38._M_impl.super__Vector_impl_data._M_start[lVar8];
      auVar12._8_8_ = dVar10;
      auVar12._0_8_ = dVar10;
      auVar12 = maxpd(auVar11,auVar12);
      auVar15._0_8_ = auVar14._0_8_ - auVar12._0_8_;
      auVar15._8_8_ = auVar14._8_8_ - auVar12._8_8_;
      auVar12 = maxpd(ZEXT816(0),auVar15);
      *(double *)(lVar4 + lVar8 * 8) = (auVar12._8_8_ + auVar12._0_8_) / (pdVar2[lVar7] / local_40);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

static void generate_transition_matrix(VEC const& weights, MAT& tm) {
    using std::abs;
    std::size_t n = weights.size();
    std::vector<double> accum(n+1, 0);
    double sum = std::accumulate(weights.begin(), weights.end(), 0.0);
    double shift = *(std::max_element(weights.begin(), weights.end())) / sum;
    accum[0] = 0;
    for (std::size_t i = 0; i < n; ++i) accum[i+1] = accum[i] + weights[i] / sum;

    for (std::size_t i = 0; i < n; ++i) {
      for (std::size_t j = 0; j < n; ++j) {
        tm[i][j] = (std::max(std::min(accum[i+1] + shift, accum[j+1]) -
                             std::max(accum[i] + shift, accum[j]), 0.0) +
                    std::max(std::min(accum[i+1] + shift, accum[j+1] + 1) -
                             std::max(accum[i] + shift, accum[j] + 1), 0.0)) / (weights[i] / sum);
      }
    }
  }